

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar1;
  char cVar2;
  ostream *poVar3;
  pointer psVar4;
  string line;
  ExpressionTree et;
  string local_1d0;
  double local_1b0;
  ExpressionTree local_1a8;
  
  expression_test();
  calculator::Lexer::Lexer(&local_1a8.lexer_);
  local_1a8.reader_.sbuffer_ = (char *)0x0;
  local_1a8.reader_.ptr_ = -1;
  local_1a8.reader_.len_ = 0;
  local_1a8.root_ = (node *)0x0;
  psVar4 = local_1a8.lexer_.tokenlist_.
           super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_1a8.lexer_.tokenlist_.
      super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.lexer_.tokenlist_.
      super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      this = (psVar4->super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != local_1a8.lexer_.tokenlist_.
                       super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_1a8.lexer_.tokenlist_.
    super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1a8.lexer_.tokenlist_.
         super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  if (*(int *)(&std::exception::typeinfo + *(long *)(std::cin + -0x18)) == 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> ",4);
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x70);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_1d0,cVar2);
      if (local_1d0._M_string_length != 0) {
        local_1b0 = calculator::ExpressionTree::calcExpression(&local_1a8,&local_1d0);
        lVar1 = std::cout;
        *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
        *(uint *)(ceilf64 + *(long *)(lVar1 + -0x18)) =
             *(uint *)(ceilf64 + *(long *)(lVar1 + -0x18)) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=> ",3);
        poVar3 = std::ostream::_M_insert<double>(local_1b0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    } while (*(int *)(&std::exception::typeinfo + *(long *)(std::cin + -0x18)) == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                               local_1d0.field_2._M_local_buf[0]) + 1);
    }
  }
  calculator::ExpressionTree::~ExpressionTree(&local_1a8);
  return 0;
}

Assistant:

int main() {
    expression_test();
    ExpressionTree et;
    string line;
    while (cin.good()) {
        cout << ">>> ";
        getline(cin, line);
        if (line.empty()) continue;
        try {
            double x = et.calcExpression(line);
            cout.precision(10);
            cout << fixed << "=> " << x << endl;
        } catch (SyntaxError &e) {
            cout << e.what() << endl;
            cin.ignore();
            cin.clear();
        }
    }
    return 0;
}